

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

bool __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Contains
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  bool bVar1;
  EvalMapStringInternal<false> *this_00;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  this_00 = this->entries;
  do {
    uVar2 = (ulong)this->writeIndex;
    if (this->filled != false) {
      uVar2 = 0xf;
    }
    uVar3 = uVar3 + 1;
    if (uVar2 <= uVar3) break;
    bVar1 = Js::EvalMapStringInternal<false>::operator==(this_00,value);
    this_00 = this_00 + 1;
  } while (!bVar1);
  return uVar3 < uVar2;
}

Assistant:

bool Contains(const T& value)
        {
            for (uint i = 0; i < GetMaxIndex(); i++)
            {
                if (DefaultComparer<T>::Equals(entries[i], value))
                {
                    return true;
                }
            }

            return false;
        }